

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UBool __thiscall icu_63::PluralRules::isKeyword(PluralRules *this,UnicodeString *keyword)

{
  int8_t iVar1;
  RuleChain *pRVar2;
  ConstChar16Ptr local_28;
  UnicodeString *local_20;
  UnicodeString *keyword_local;
  PluralRules *this_local;
  
  local_20 = keyword;
  keyword_local = (UnicodeString *)this;
  ConstChar16Ptr::ConstChar16Ptr(&local_28,(char16_t *)PLURAL_KEYWORD_OTHER);
  iVar1 = UnicodeString::compare(keyword,&local_28,5);
  ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  if (iVar1 == '\0') {
    this_local._7_1_ = true;
  }
  else {
    pRVar2 = rulesForKeyword(this,local_20);
    this_local._7_1_ = pRVar2 != (RuleChain *)0x0;
  }
  return this_local._7_1_;
}

Assistant:

UBool
PluralRules::isKeyword(const UnicodeString& keyword) const {
    if (0 == keyword.compare(PLURAL_KEYWORD_OTHER, 5)) {
        return true;
    }
    return rulesForKeyword(keyword) != nullptr;
}